

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

bool __thiscall
gguf_reader::read<short>(gguf_reader *this,vector<short,_std::allocator<short>_> *dst,size_t n)

{
  pointer psVar1;
  bool bVar2;
  short *dst_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  std::vector<short,_std::allocator<short>_>::resize(dst,n);
  uVar5 = 0xffffffffffffffff;
  lVar3 = 0;
  do {
    psVar1 = (dst->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(dst->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)psVar1 >> 1;
    uVar5 = uVar5 + 1;
    if (uVar4 <= uVar5) break;
    dst_00 = (short *)((long)psVar1 + lVar3);
    lVar3 = lVar3 + 2;
    bVar2 = read<short>(this,dst_00);
  } while (bVar2);
  return uVar4 <= uVar5;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }